

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3EvalAllocateReaders(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pnToken,int *pnOr,int *pRc)

{
  int iVar1;
  int nTerm;
  int iVar2;
  char *zTerm;
  Fts3Table *p;
  int iVar3;
  int iVar4;
  Fts3MultiSegReader *pCsr_00;
  long lVar5;
  Fts3Phrase *pFVar6;
  Fts3Index *pFVar7;
  long lVar8;
  long lVar9;
  
  if (pExpr == (Fts3Expr *)0x0) {
    return;
  }
  while( true ) {
    if (*pRc != 0) {
      return;
    }
    if (pExpr->eType == 5) break;
    *pnOr = *pnOr + (uint)(pExpr->eType == 4);
    fts3EvalAllocateReaders(pCsr,pExpr->pLeft,pnToken,pnOr,pRc);
    pExpr = pExpr->pRight;
    if (pExpr == (Fts3Expr *)0x0) {
      return;
    }
  }
  pFVar6 = pExpr->pPhrase;
  iVar1 = pFVar6->nToken;
  *pnToken = *pnToken + iVar1;
  if (0 < (long)iVar1) {
    lVar9 = 0;
    do {
      pFVar6 = pExpr->pPhrase;
      zTerm = pFVar6->aToken[lVar9].z;
      nTerm = pFVar6->aToken[lVar9].n;
      iVar2 = pFVar6->aToken[lVar9].isPrefix;
      iVar3 = sqlite3_initialize();
      iVar4 = 7;
      if ((iVar3 != 0) ||
         (pCsr_00 = (Fts3MultiSegReader *)sqlite3Malloc(0x58), pCsr_00 == (Fts3MultiSegReader *)0x0)
         ) {
        pCsr_00 = (Fts3MultiSegReader *)0x0;
LAB_001bdc9d:
        pFVar6->aToken[lVar9].pSegcsr = pCsr_00;
LAB_001bdca1:
        *pRc = iVar4;
        return;
      }
      p = (Fts3Table *)(pCsr->base).pVtab;
      if (iVar2 != 0) {
        lVar5 = (long)p->nIndex;
        if (1 < lVar5) {
          pFVar7 = p->aIndex;
          lVar8 = 1;
          do {
            pFVar7 = pFVar7 + 1;
            if (pFVar7->nPrefix == nTerm) {
              iVar2 = pCsr->iLangid;
              *(undefined8 *)&pCsr_00->nTerm = 0;
              pCsr_00->aDoclist = (char *)0x0;
              *(undefined8 *)&pCsr_00->bLookup = 0;
              pCsr_00->zTerm = (char *)0x0;
              pCsr_00->nBuffer = 0;
              pCsr_00->iColFilter = 0;
              pCsr_00->bRestart = 0;
              pCsr_00->nCost = 0;
              pCsr_00->pFilter = (Fts3SegFilter *)0x0;
              pCsr_00->aBuffer = (char *)0x0;
              pCsr_00->apSegment = (Fts3SegReader **)0x0;
              pCsr_00->nSegment = 0;
              pCsr_00->nAdvance = 0;
              *(undefined8 *)&pCsr_00->nDoclist = 0;
              iVar4 = fts3SegReaderCursor(p,iVar2,(int)lVar8,-2,zTerm,nTerm,0,0,pCsr_00);
              pCsr_00->bLookup = 1;
              goto LAB_001bdb96;
            }
            lVar8 = lVar8 + 1;
          } while (lVar5 != lVar8);
          if (1 < p->nIndex) {
            pFVar7 = p->aIndex;
            lVar8 = 1;
            do {
              pFVar7 = pFVar7 + 1;
              if (pFVar7->nPrefix == nTerm + 1) {
                iVar2 = pCsr->iLangid;
                *(undefined8 *)&pCsr_00->nTerm = 0;
                pCsr_00->aDoclist = (char *)0x0;
                *(undefined8 *)&pCsr_00->bLookup = 0;
                pCsr_00->zTerm = (char *)0x0;
                pCsr_00->nBuffer = 0;
                pCsr_00->iColFilter = 0;
                pCsr_00->bRestart = 0;
                pCsr_00->nCost = 0;
                pCsr_00->pFilter = (Fts3SegFilter *)0x0;
                pCsr_00->aBuffer = (char *)0x0;
                pCsr_00->apSegment = (Fts3SegReader **)0x0;
                pCsr_00->nSegment = 0;
                pCsr_00->nAdvance = 0;
                *(undefined8 *)&pCsr_00->nDoclist = 0;
                iVar4 = fts3SegReaderCursor(p,iVar2,(int)lVar8,-2,zTerm,nTerm,1,0,pCsr_00);
                if (iVar4 != 0) goto LAB_001bdc9d;
                iVar4 = fts3SegReaderCursor(p,pCsr->iLangid,0,-2,zTerm,nTerm,0,0,pCsr_00);
                goto LAB_001bdb96;
              }
              lVar8 = lVar8 + 1;
            } while (lVar5 != lVar8);
          }
        }
      }
      iVar3 = pCsr->iLangid;
      *(undefined8 *)&pCsr_00->nTerm = 0;
      pCsr_00->aDoclist = (char *)0x0;
      *(undefined8 *)&pCsr_00->bLookup = 0;
      pCsr_00->zTerm = (char *)0x0;
      pCsr_00->nBuffer = 0;
      pCsr_00->iColFilter = 0;
      pCsr_00->bRestart = 0;
      pCsr_00->nCost = 0;
      pCsr_00->pFilter = (Fts3SegFilter *)0x0;
      pCsr_00->aBuffer = (char *)0x0;
      pCsr_00->apSegment = (Fts3SegReader **)0x0;
      pCsr_00->nSegment = 0;
      pCsr_00->nAdvance = 0;
      *(undefined8 *)&pCsr_00->nDoclist = 0;
      iVar4 = fts3SegReaderCursor(p,iVar3,0,-2,zTerm,nTerm,iVar2,0,pCsr_00);
      pCsr_00->bLookup = (uint)(iVar2 == 0);
LAB_001bdb96:
      pFVar6->aToken[lVar9].pSegcsr = pCsr_00;
      if (iVar4 != 0) goto LAB_001bdca1;
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar1);
    pFVar6 = pExpr->pPhrase;
  }
  pFVar6->iDoclistToken = -1;
  return;
}

Assistant:

static void fts3EvalAllocateReaders(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Allocate readers for this expression */
  int *pnToken,                   /* OUT: Total number of tokens in phrase. */
  int *pnOr,                      /* OUT: Total number of OR nodes in expr. */
  int *pRc                        /* IN/OUT: Error code */
){
  if( pExpr && SQLITE_OK==*pRc ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      int i;
      int nToken = pExpr->pPhrase->nToken;
      *pnToken += nToken;
      for(i=0; i<nToken; i++){
        Fts3PhraseToken *pToken = &pExpr->pPhrase->aToken[i];
        int rc = fts3TermSegReaderCursor(pCsr, 
            pToken->z, pToken->n, pToken->isPrefix, &pToken->pSegcsr
        );
        if( rc!=SQLITE_OK ){
          *pRc = rc;
          return;
        }
      }
      assert( pExpr->pPhrase->iDoclistToken==0 );
      pExpr->pPhrase->iDoclistToken = -1;
    }else{
      *pnOr += (pExpr->eType==FTSQUERY_OR);
      fts3EvalAllocateReaders(pCsr, pExpr->pLeft, pnToken, pnOr, pRc);
      fts3EvalAllocateReaders(pCsr, pExpr->pRight, pnToken, pnOr, pRc);
    }
  }
}